

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O0

void adjuststack(luaL_Buffer *B)

{
  size_t sVar1;
  size_t sVar2;
  long in_RDI;
  size_t l;
  size_t toplen;
  int toget;
  lua_State *L;
  undefined4 in_stack_ffffffffffffffe8;
  int idx;
  lua_State *L_00;
  
  if (1 < *(int *)(in_RDI + 8)) {
    L_00 = *(lua_State **)(in_RDI + 0x10);
    idx = 1;
    sVar1 = lua_objlen(L_00,1);
    do {
      sVar2 = lua_objlen(L_00,idx);
      if (((*(int *)(in_RDI + 8) - idx) + 1 < 10) && (sVar1 <= sVar2)) break;
      sVar1 = sVar2 + sVar1;
      idx = idx + 1;
    } while (idx < *(int *)(in_RDI + 8));
    lua_concat((lua_State *)CONCAT44(idx,in_stack_ffffffffffffffe8),(int)(sVar1 >> 0x20));
    *(int *)(in_RDI + 8) = (*(int *)(in_RDI + 8) - idx) + 1;
  }
  return;
}

Assistant:

static void adjuststack(luaL_Buffer *B)
{
  if (B->lvl > 1) {
    lua_State *L = B->L;
    int toget = 1;  /* number of levels to concat */
    size_t toplen = lua_strlen(L, -1);
    do {
      size_t l = lua_strlen(L, -(toget+1));
      if (!(B->lvl - toget + 1 >= LUA_MINSTACK/2 || toplen > l))
	break;
      toplen += l;
      toget++;
    } while (toget < B->lvl);
    lua_concat(L, toget);
    B->lvl = B->lvl - toget + 1;
  }
}